

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void SendPeerSetupMsg(WS_ReaderInfo reader,int reversePeer,int myRank)

{
  int iVar1;
  undefined4 in_EDX;
  uint in_ESI;
  long *in_RDI;
  _PeerSetupMsg setup;
  SstStream Stream;
  CMConnection conn;
  undefined8 local_30;
  undefined4 local_28;
  int local_24;
  SstStream local_20;
  undefined8 local_18;
  undefined4 local_10;
  uint local_c;
  long *local_8;
  
  local_18 = *(undefined8 *)(in_RDI[0x11] + (long)(int)in_ESI * 0x18 + 0x10);
  local_20 = (SstStream)*in_RDI;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(&local_30,0,0x10);
  local_30 = *(undefined8 *)(local_8[0x11] + (long)(int)local_c * 0x18 + 8);
  local_28 = local_10;
  local_24 = local_20->CohortSize;
  iVar1 = CMwrite(local_18,local_20->CPInfo->SharedCM->PeerSetupFormat,&local_30);
  if (iVar1 != 1) {
    CP_verbose(local_20,CriticalVerbose,
               "Message failed to send to reader peer rank %d in sendPeerSetup in reader open\n",
               (ulong)local_c);
  }
  return;
}

Assistant:

static void SendPeerSetupMsg(WS_ReaderInfo reader, int reversePeer, int myRank)
{
    CMConnection conn = reader->Connections[reversePeer].CMconn;
    SstStream Stream = reader->ParentStream;
    struct _PeerSetupMsg setup;
    memset(&setup, 0, sizeof(setup));
    setup.RS_Stream = reader->Connections[reversePeer].RemoteStreamID;
    setup.WriterRank = myRank;
    setup.WriterCohortSize = Stream->CohortSize;
    STREAM_ASSERT_UNLOCKED(Stream);
    if (CMwrite(conn, Stream->CPInfo->SharedCM->PeerSetupFormat, &setup) != 1)
    {
        CP_verbose(Stream, CriticalVerbose,
                   "Message failed to send to reader peer rank %d in sendPeerSetup in "
                   "reader open\n",
                   reversePeer);
    }
}